

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFConsoleDemo.cpp
# Opt level: O0

void __thiscall VariableEffect::reset(VariableEffect *this)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>
  *in_RDI;
  iterator iterVars;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Self in_stack_ffffffffffffffd8;
  _Self local_20;
  _Base_ptr local_18;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>
  local_10 [2];
  
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>
  ::_Rb_tree_iterator(local_10);
  local_18 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
             ::begin(in_stack_ffffffffffffffc8);
  local_10[0]._M_node = local_18;
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(local_10,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>
             ::operator->(in_RDI);
    Variable::reset(ppVar2->second);
    in_stack_ffffffffffffffd8 =
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>
         ::operator++(in_stack_ffffffffffffffd8._M_node,(int)((ulong)in_RDI >> 0x20));
  }
  (*(code *)in_RDI[8]._M_node)(in_RDI + 2,in_RDI[1]._M_node);
  return;
}

Assistant:

void reset()
	{
		MapVariables::iterator iterVars;
		for(iterVars = _mapVariables.begin(); iterVars != _mapVariables.end(); iterVars++)
			iterVars->second->reset();
		_pfApplyVariables(_mapVariables, _pEffect);
	}